

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O1

Gia_Man_t * Gia_PermuteSpecial(Gia_Man_t *p)

{
  int *piVar1;
  Vec_Int_t *vPiPerm;
  Gia_Man_t *pGVar2;
  int iVar3;
  
  piVar1 = Gia_PermuteSpecialOrder(p);
  iVar3 = p->vCis->nSize - p->nRegs;
  vPiPerm = (Vec_Int_t *)malloc(0x10);
  vPiPerm->nSize = iVar3;
  vPiPerm->nCap = iVar3;
  vPiPerm->pArray = piVar1;
  pGVar2 = Gia_ManDupPerm(p,vPiPerm);
  if (vPiPerm->pArray != (int *)0x0) {
    free(vPiPerm->pArray);
    vPiPerm->pArray = (int *)0x0;
  }
  free(vPiPerm);
  return pGVar2;
}

Assistant:

Gia_Man_t * Gia_PermuteSpecial( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Vec_Int_t * vPerm;
    int * pOrder = Gia_PermuteSpecialOrder( p );
    vPerm = Vec_IntAllocArray( pOrder, Gia_ManPiNum(p) );
    pNew = Gia_ManDupPerm( p, vPerm );
    Vec_IntFree( vPerm );
    return pNew;
}